

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O1

int pitch_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint32_t samples;
  float *out;
  float *in;
  uint32_t local_3c;
  float *local_38;
  float *local_30;
  
  puVar2 = (undefined8 *)segment->data;
  if ((*(float *)((long)puVar2 + 100) != 1.0) || (NAN(*(float *)((long)puVar2 + 100)))) {
    local_3c = 0xffffffff;
    fVar1 = *(float *)(puVar2 + 0xd);
    mixed_buffer_request_read(&local_30,&local_3c,(mixed_buffer *)*puVar2);
    mixed_buffer_request_write(&local_38,&local_3c,(mixed_buffer *)puVar2[1]);
    fft_window_resolver(local_30,local_38,local_3c,puVar2 + 2,fft_pitch_shift_resolver,
                        (long)puVar2 + 100);
    if ((ulong)local_3c != 0) {
      uVar3 = 0;
      do {
        local_38[uVar3] = local_30[uVar3] * (1.0 - fVar1) + local_38[uVar3] * fVar1;
        uVar3 = uVar3 + 1;
      } while (local_3c != uVar3);
    }
    mixed_buffer_finish_read(local_3c,(mixed_buffer *)*puVar2);
    mixed_buffer_finish_write(local_3c,(mixed_buffer *)puVar2[1]);
  }
  else {
    mixed_buffer_transfer((mixed_buffer *)*puVar2,(mixed_buffer *)puVar2[1]);
  }
  return 1;
}

Assistant:

int pitch_segment_mix(struct mixed_segment *segment){
  struct pitch_segment_data *data = (struct pitch_segment_data *)segment->data;

  if(data->pitch == 1.0){
    mixed_buffer_transfer(data->in, data->out);
  }else{
    float *restrict in, *restrict out;
    uint32_t samples = UINT32_MAX;
    float mix = data->mix;
    mixed_buffer_request_read(&in, &samples, data->in);
    mixed_buffer_request_write(&out, &samples, data->out);
    fft_window(in, out, samples, &data->fft_window_data, fft_pitch_shift, &data->pitch);
    for(uint32_t i=0; i<samples; ++i){
      out[i] = LERP(in[i], out[i], mix);
    }
    mixed_buffer_finish_read(samples, data->in);
    mixed_buffer_finish_write(samples, data->out);
  }
  return 1;
}